

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonArray.cpp
# Opt level: O2

json_array_element_t * __thiscall Json::JsonArray::get(JsonArray *this,int index)

{
  reference pvVar1;
  JsonException *this_00;
  allocator<char> local_39;
  string local_38;
  
  if ((-1 < index) &&
     (index < (int)((ulong)((long)(this->__lstJsonArray).
                                  super__Vector_base<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->__lstJsonArray).
                                 super__Vector_base<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
    pvVar1 = std::
             vector<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
             ::at(&this->__lstJsonArray,(ulong)(uint)index);
    return pvVar1;
  }
  this_00 = (JsonException *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Error: Invalid Index",&local_39);
  JsonException::JsonException(this_00,&local_38);
  __cxa_throw(this_00,&JsonException::typeinfo,JsonException::~JsonException);
}

Assistant:

const Json::JsonArray::json_array_element_t &Json::JsonArray::get(int index) {
    if (index < 0 || index >= size())throw JsonException("Error: Invalid Index");
    return __lstJsonArray.at(index);
}